

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void file_compress(char *file,char *mode)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  gzFile pgVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  gzFile unaff_R12;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  char outfile [1024];
  undefined4 uStack_888;
  undefined1 uStack_884;
  char *pcStack_870;
  gzFile pgStack_868;
  ulong uStack_860;
  char *pcStack_858;
  char *pcStack_850;
  char acStack_840 [1024];
  char *pcStack_440;
  char acStack_418 [1024];
  
  pcVar8 = acStack_418;
  pcVar7 = mode;
  sVar3 = strlen(file);
  if (sVar3 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_418,0x400,"%s%s",file,".gz");
    pcVar7 = "rb";
    pFVar4 = fopen(file,"rb");
    if (pFVar4 == (FILE *)0x0) goto LAB_001016f1;
    pcVar7 = mode;
    pgVar5 = (gzFile)gzopen(acStack_418);
    if (pgVar5 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar4,pgVar5);
      unlink(file);
      return;
    }
  }
  file_compress_cold_1();
  pcVar14 = acStack_840;
  pcStack_440 = file;
  pcVar6 = (char *)strlen(pcVar8);
  uVar11 = (ulong)pcVar6 & 0xffffffff;
  if (uVar11 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_840,0x400,"%s",pcVar8);
    if (((uint)pcVar6 < 4) || (iVar1 = strcmp(pcVar8 + (uVar11 - 3),".gz"), iVar1 != 0)) {
      unaff_R12 = (gzFile)(0x400 - uVar11);
      snprintf(acStack_840 + uVar11,(size_t)unaff_R12,"%s",".gz");
      mode = acStack_840;
      pcVar14 = pcVar8;
    }
    else {
      acStack_840[(uint)pcVar6 - 3] = '\0';
      mode = pcVar8;
    }
    pcVar7 = "rb";
    pgVar5 = (gzFile)gzopen(mode);
    pcVar6 = pcVar14;
    if (pgVar5 == (gzFile)0x0) goto LAB_001017f3;
    pcVar7 = "wb";
    pFVar4 = fopen(pcVar14,"wb");
    if (pFVar4 != (FILE *)0x0) {
      gz_uncompress(pgVar5,(FILE *)pFVar4);
      unlink(mode);
      return;
    }
  }
  else {
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar5 = unaff_R12;
    file_uncompress_cold_2();
  }
  pcVar9 = pcVar8;
  file_uncompress_cold_1();
  uVar13 = (ulong)pcVar9 & 0xffffffff;
  uStack_884 = 0;
  uStack_888 = 0x20366277;
  pcVar14 = *(char **)pcVar7;
  prog = pcVar14;
  pcStack_870 = pcVar8;
  pgStack_868 = pgVar5;
  uStack_860 = uVar11;
  pcStack_858 = mode;
  pcStack_850 = pcVar6;
  pcVar6 = strrchr(pcVar14,0x2f);
  pcVar8 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    pcVar8 = pcVar14;
  }
  iVar1 = strcmp(pcVar8,"gunzip");
  if (iVar1 == 0) {
    bVar15 = true;
    bVar10 = false;
  }
  else {
    iVar1 = strcmp(pcVar8,"zcat");
    bVar15 = iVar1 == 0;
    bVar10 = bVar15;
  }
  pcVar7 = pcVar7 + 8;
  iVar1 = (int)pcVar9 + -1;
  if (1 < (int)pcVar9) {
    do {
      pcVar8 = *(char **)pcVar7;
      iVar2 = strcmp(pcVar8,"-c");
      if (iVar2 == 0) {
        bVar10 = true;
      }
      else {
        iVar2 = strcmp(pcVar8,"-d");
        if (iVar2 == 0) {
          bVar15 = true;
        }
        else {
          iVar2 = strcmp(pcVar8,"-f");
          if (iVar2 == 0) {
            uStack_888 = CONCAT13(0x66,(undefined3)uStack_888);
          }
          else {
            iVar2 = strcmp(pcVar8,"-h");
            if (iVar2 == 0) {
              uStack_888 = CONCAT13(0x68,(undefined3)uStack_888);
            }
            else {
              iVar2 = strcmp(pcVar8,"-r");
              if (iVar2 == 0) {
                uStack_888 = CONCAT13(0x52,(undefined3)uStack_888);
              }
              else {
                if (*pcVar8 != '-') {
                  iVar1 = (int)uVar13 + -1;
                  goto LAB_0010195d;
                }
                if ((8 < (byte)(pcVar8[1] - 0x31U)) || (pcVar8[2] != '\0')) goto LAB_0010195d;
                uStack_888._0_3_ = CONCAT12(pcVar8[1],(undefined2)uStack_888);
              }
            }
          }
        }
      }
      pcVar7 = pcVar7 + 8;
      iVar1 = iVar1 + -1;
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (1 < (int)uVar12);
    iVar1 = 0;
  }
LAB_0010195d:
  if (uStack_888._3_1_ == ' ') {
    uStack_888 = uStack_888 & 0xffffff;
  }
  if (iVar1 == 0) {
    if (bVar15) {
      iVar1 = fileno(_stdin);
      pgVar5 = (gzFile)gzdopen(iVar1,"rb");
      if (pgVar5 == (gzFile)0x0) {
LAB_00101abc:
        main_cold_3();
LAB_00101ac1:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar5,(FILE *)_stdout);
    }
    else {
      iVar1 = fileno(_stdout);
      pgVar5 = (gzFile)gzdopen(iVar1,&uStack_888);
      if (pgVar5 == (gzFile)0x0) goto LAB_00101ac1;
      gz_compress((FILE *)_stdin,pgVar5);
    }
  }
  else {
    do {
      pcVar8 = *(char **)pcVar7;
      if (bVar15) {
        if (bVar10) {
          pgVar5 = (gzFile)gzopen(pcVar8,"rb");
          if (pgVar5 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar5,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar8);
        }
      }
      else if (bVar10) {
        pFVar4 = fopen(pcVar8,"rb");
        if (pFVar4 == (FILE *)0x0) {
          perror(*(char **)pcVar7);
        }
        else {
          iVar2 = fileno(_stdout);
          pgVar5 = (gzFile)gzdopen(iVar2,&uStack_888);
          if (pgVar5 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101abc;
          }
          gz_compress((FILE *)pFVar4,pgVar5);
        }
      }
      else {
        file_compress(pcVar8,(char *)&uStack_888);
      }
      pcVar7 = pcVar7 + 8;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void file_compress(file, mode)
    char  *file;
    char  *mode;
{
    local char outfile[MAX_NAME_LEN];
    FILE  *in;
    gzFile out;

    if (strlen(file) + strlen(GZ_SUFFIX) >= sizeof(outfile)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outfile, sizeof(outfile), "%s%s", file, GZ_SUFFIX);
#else
    strcpy(outfile, file);
    strcat(outfile, GZ_SUFFIX);
#endif

    in = fopen(file, "rb");
    if (in == NULL) {
        perror(file);
        exit(1);
    }
    out = gzopen(outfile, mode);
    if (out == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, outfile);
        exit(1);
    }
    gz_compress(in, out);

    unlink(file);
}